

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O2

int __thiscall
glcts::GeometryShaderRenderingLinesCase::verify
          (GeometryShaderRenderingLinesCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,
          uchar *tbs,size_t tbslen)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  _func_int **pp_Var8;
  ulong uVar9;
  long lVar10;
  MessageBuilder *pMVar11;
  TestError *this_00;
  uint uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  uint local_278;
  uint single_rt_height;
  Vec4 expected_rgba;
  uint single_rt_width;
  float rendered_rgba [4];
  float reference_rgba [4];
  float rendered_rgba_1 [4];
  Vector<float,_4> VStack_1f8;
  GeometryShaderRenderingLinesCase *local_1e0;
  uint rt_width;
  uint rt_height;
  Vector<float,_4> VStack_1d0;
  tcu atStack_1c0 [16];
  undefined1 auStack_1b0 [8];
  _func_int **pp_Stack_1a8;
  
  rt_height = 0;
  rt_width = 0;
  single_rt_height = 0;
  single_rt_width = 0;
  pp_Var8 = (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
            super_TestNode._vptr_TestNode;
  if (((uint)ctx & 0xfffffffd) == 1) {
    uVar5 = (*pp_Var8[5])(this);
    uVar9 = (ulong)uVar5;
    pp_Var8 = (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
              super_TestNode._vptr_TestNode;
  }
  else {
    uVar9 = 1;
  }
  (*pp_Var8[0xd])(this,uVar9,&rt_width,&rt_height);
  (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
    _vptr_TestNode[0xd])(this,1,&single_rt_width,&single_rt_height);
  iVar6 = rt_width * 4;
  iVar17 = *(int *)&(this->super_GeometryShaderRenderingCase).field_0x304;
  local_278 = (uint)sig;
  if (iVar17 == 0) {
    local_1e0 = this;
    tcu::Vector<float,_4>::Vector(&expected_rgba);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)rendered_rgba);
    iVar13 = local_278 * single_rt_height + 1;
    expected_rgba.m_data[0] = 0.0;
    expected_rgba.m_data[1] = 1.0;
    expected_rgba.m_data[2] = 0.0;
    expected_rgba.m_data[3] = 0.0;
    rendered_rgba[0] = 1.0;
    rendered_rgba[1] = 0.0;
    bVar1 = 1;
    iVar17 = 6;
    iVar15 = 0;
    iVar16 = 1;
    do {
      rendered_rgba[2] = 0.0;
      rendered_rgba[3] = 0.0;
      iVar19 = iVar16 * 4;
      uVar5 = iVar6 * iVar13;
      for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
        if (!(bool)(bVar1 & lVar10 == 0)) {
          iVar7 = (int)lVar10;
          reference_rgba[0] = 0.0;
          reference_rgba[1] = 0.0;
          reference_rgba[2] = 0.0;
          reference_rgba[3] = 0.0;
          rendered_rgba_1[0] = 0.0;
          rendered_rgba_1[1] = 0.0;
          rendered_rgba_1[2] = 0.0;
          rendered_rgba_1[3] = 0.0;
          for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
            reference_rgba[lVar14] =
                 ((expected_rgba.m_data[lVar14] - rendered_rgba[lVar14]) * (float)iVar7) / 7.0 +
                 rendered_rgba[lVar14];
            rendered_rgba_1[lVar14] =
                 (float)*(byte *)((ulong)uVar5 + (long)iVar19 + siglen + lVar14) / 255.0;
          }
          fVar21 = rendered_rgba_1[0];
          fVar20 = reference_rgba[0];
          fVar23 = rendered_rgba_1[0] - reference_rgba[0];
          fVar22 = -fVar23;
          if (-fVar23 <= fVar23) {
            fVar22 = fVar23;
          }
          if (fVar22 <= 0.00390625) {
            fVar23 = rendered_rgba_1[1] - reference_rgba[1];
            fVar22 = -fVar23;
            if (-fVar23 <= fVar23) {
              fVar22 = fVar23;
            }
            if (fVar22 <= 0.00390625) {
              fVar23 = rendered_rgba_1[2] - reference_rgba[2];
              fVar22 = -fVar23;
              if (-fVar23 <= fVar23) {
                fVar22 = fVar23;
              }
              if (fVar22 <= 0.00390625) {
                fVar23 = rendered_rgba_1[3] - reference_rgba[3];
                fVar22 = -fVar23;
                if (-fVar23 <= fVar23) {
                  fVar22 = fVar23;
                }
                if (fVar22 <= 0.00390625) goto LAB_00cfd707;
              }
            }
          }
          auStack_1b0 = (undefined1  [8])
                        ((local_1e0->super_GeometryShaderRenderingCase).super_TestCaseBase.
                         super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
          std::operator<<((ostream *)&pp_Stack_1a8,"Rendered data at (");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,iVar7 * iVar17 + iVar16);
          std::operator<<((ostream *)&pp_Stack_1a8,", ");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,iVar15 * iVar7 + iVar13);
          std::operator<<((ostream *)&pp_Stack_1a8,") ");
          std::operator<<((ostream *)&pp_Stack_1a8,"equal (");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,fVar21);
          std::operator<<((ostream *)&pp_Stack_1a8,", ");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,rendered_rgba_1[1]);
          std::operator<<((ostream *)&pp_Stack_1a8,", ");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,rendered_rgba_1[2]);
          std::operator<<((ostream *)&pp_Stack_1a8,", ");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,rendered_rgba_1[3]);
          std::operator<<((ostream *)&pp_Stack_1a8,") ");
          std::operator<<((ostream *)&pp_Stack_1a8,
                          "exceeds allowed epsilon when compared to reference data equal (");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,fVar20);
          std::operator<<((ostream *)&pp_Stack_1a8,", ");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,reference_rgba[1]);
          std::operator<<((ostream *)&pp_Stack_1a8,", ");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,reference_rgba[2]);
          std::operator<<((ostream *)&pp_Stack_1a8,", ");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,reference_rgba[3]);
          std::operator<<((ostream *)&pp_Stack_1a8,").");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)auStack_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Data comparison failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0xe4a);
          goto LAB_00cfd49e;
        }
LAB_00cfd707:
        iVar19 = iVar19 + iVar17 * 4;
        uVar5 = uVar5 + iVar15 * iVar6;
      }
      rendered_rgba[0] = 0.0;
      expected_rgba.m_data[0] = 0.0;
      expected_rgba.m_data[1] = 0.0;
      expected_rgba.m_data[2] = 1.0;
      expected_rgba.m_data[3] = 0.0;
      rendered_rgba[1] = 1.0;
      iVar17 = 0;
      iVar15 = 6;
      bVar1 = 0;
      iVar16 = single_rt_width - 1;
    } while( true );
  }
  if (iVar17 == 1) {
    uVar5 = 1;
    local_1e0 = this;
    for (iVar17 = 0; iVar17 != 4; iVar17 = iVar17 + 1) {
      tcu::Vector<float,_4>::Vector(&expected_rgba);
      uVar4 = single_rt_width;
      iVar15 = single_rt_height * local_278 + 1;
      reference_rgba[0] = 1.0;
      reference_rgba[1] = 0.0;
      reference_rgba[2] = 0.0;
      reference_rgba[3] = 0.0;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)rendered_rgba_1,0.5);
      tcu::operator*((tcu *)rendered_rgba,(Vector<float,_4> *)reference_rgba,
                     (Vector<float,_4> *)rendered_rgba_1);
      VStack_1f8.m_data[0] = 0.0;
      VStack_1f8.m_data[1] = 1.0;
      VStack_1f8.m_data[2] = 0.0;
      VStack_1f8.m_data[3] = 0.0;
      tcu::Vector<float,_4>::Vector(&VStack_1d0,0.5);
      tcu::operator*(atStack_1c0,&VStack_1f8,&VStack_1d0);
      tcu::operator+((tcu *)auStack_1b0,(Vector<float,_4> *)rendered_rgba,
                     (Vector<float,_4> *)atStack_1c0);
      expected_rgba.m_data[0] = (float)auStack_1b0._0_4_;
      expected_rgba.m_data[1] = (float)auStack_1b0._4_4_;
      uVar2 = expected_rgba.m_data._0_8_;
      expected_rgba.m_data._8_8_ = pp_Stack_1a8;
      uVar3 = expected_rgba.m_data._8_8_;
      uVar5 = uVar4 - 6;
      expected_rgba.m_data[0] = auStack_1b0._0_4_;
      expected_rgba.m_data[1] = auStack_1b0._4_4_;
      expected_rgba.m_data[2] = SUB84(pp_Stack_1a8,0);
      expected_rgba.m_data[3] = (float)((ulong)pp_Stack_1a8 >> 0x20);
      uVar12 = 0;
      if ((int)uVar5 < 1) {
        uVar5 = uVar12;
      }
      for (; expected_rgba.m_data._0_8_ = uVar2, expected_rgba.m_data._8_8_ = uVar3, uVar12 != uVar5
          ; uVar12 = uVar12 + 1) {
        uVar18 = uVar12;
        if (uVar4 == 6) {
          uVar18 = 0;
        }
        rendered_rgba[0] = 0.0;
        rendered_rgba[1] = 0.0;
        rendered_rgba[2] = 0.0;
        rendered_rgba[3] = 0.0;
        for (lVar10 = 0; fVar20 = rendered_rgba[0], lVar10 != 4; lVar10 = lVar10 + 1) {
          rendered_rgba[lVar10] =
               (float)*(byte *)((long)(int)((uVar18 + 3) * 4) + siglen +
                                (ulong)(uint)(iVar15 * iVar6) + lVar10) / 255.0;
        }
        fVar22 = rendered_rgba[0] - expected_rgba.m_data[0];
        fVar21 = -fVar22;
        if (-fVar22 <= fVar22) {
          fVar21 = fVar22;
        }
        if (0.00390625 < fVar21) {
LAB_00cfd0e1:
          auStack_1b0 = (undefined1  [8])
                        ((local_1e0->super_GeometryShaderRenderingCase).super_TestCaseBase.
                         super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
          std::operator<<((ostream *)&pp_Stack_1a8,"Rendered data at (");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,uVar18 + 3);
          std::operator<<((ostream *)&pp_Stack_1a8,", ");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,iVar15);
          std::operator<<((ostream *)&pp_Stack_1a8,") ");
          std::operator<<((ostream *)&pp_Stack_1a8,"equal (");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,fVar20);
          std::operator<<((ostream *)&pp_Stack_1a8,", ");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,rendered_rgba[1]);
          std::operator<<((ostream *)&pp_Stack_1a8,", ");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,rendered_rgba[2]);
          std::operator<<((ostream *)&pp_Stack_1a8,", ");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,rendered_rgba[3]);
          std::operator<<((ostream *)&pp_Stack_1a8,") ");
          std::operator<<((ostream *)&pp_Stack_1a8,
                          "exceeds allowed epsilon when compared to reference data equal (");
          std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,expected_rgba.m_data[0]);
          std::operator<<((ostream *)&pp_Stack_1a8,", ");
          pMVar11 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)auStack_1b0,expected_rgba.m_data + 1);
          std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ")
          ;
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,expected_rgba.m_data + 2);
          std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ")
          ;
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,expected_rgba.m_data + 3);
          std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").")
          ;
          tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Data comparison failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0xdc4);
          goto LAB_00cfd49e;
        }
        fVar22 = rendered_rgba[1] - expected_rgba.m_data[1];
        fVar21 = -fVar22;
        if (-fVar22 <= fVar22) {
          fVar21 = fVar22;
        }
        if (0.00390625 < fVar21) goto LAB_00cfd0e1;
        fVar22 = rendered_rgba[2] - expected_rgba.m_data[2];
        fVar21 = -fVar22;
        if (-fVar22 <= fVar22) {
          fVar21 = fVar22;
        }
        if (0.00390625 < fVar21) goto LAB_00cfd0e1;
        fVar22 = rendered_rgba[3] - expected_rgba.m_data[3];
        fVar21 = -fVar22;
        if (-fVar22 <= fVar22) {
          fVar21 = fVar22;
        }
        if (0.00390625 < fVar21) goto LAB_00cfd0e1;
      }
    }
  }
  else {
    if (iVar17 != 2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unsupported shader output type used",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xebb);
LAB_00cfd49e:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    fVar20 = (float)((ulong)sig & 0xffffffff);
    uVar5 = local_278;
    for (iVar17 = 0; iVar17 != 4; iVar17 = iVar17 + 1) {
      tcu::Vector<float,_4>::Vector(&expected_rgba);
      expected_rgba.m_data[0] = 1.0;
      expected_rgba.m_data[1] = 0.0;
      expected_rgba.m_data[2] = 0.0;
      expected_rgba.m_data[3] = 0.0;
      uVar9 = (ulong)single_rt_width;
      iVar15 = (int)((float)single_rt_height * ((fVar20 + fVar20 + fVar20 + 0.5) / 3.0));
      lVar10 = (uint)(iVar6 * iVar15) + siglen;
      lVar14 = (long)((int)((float)uVar9 * 0.5) * 4);
      fVar26 = (float)*(byte *)(lVar14 + lVar10) / 255.0;
      fVar25 = (float)*(byte *)(lVar14 + 1 + lVar10) / 255.0;
      fVar24 = (float)*(byte *)(lVar14 + 2 + lVar10) / 255.0;
      bVar1 = *(byte *)(lVar14 + 3 + lVar10);
      uVar5 = (uint)bVar1;
      fVar23 = (float)bVar1 / 255.0;
      fVar22 = fVar26 - 1.0;
      fVar21 = -fVar22;
      if (-fVar22 <= fVar22) {
        fVar21 = fVar22;
      }
      if (0.00390625 < fVar21) {
LAB_00cfd2a7:
        auStack_1b0 = (undefined1  [8])
                      ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
        std::operator<<((ostream *)&pp_Stack_1a8,"Rendered data at (");
        std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,(int)((float)uVar9 * 0.5));
        std::operator<<((ostream *)&pp_Stack_1a8,", ");
        std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,iVar15);
        std::operator<<((ostream *)&pp_Stack_1a8,") ");
        std::operator<<((ostream *)&pp_Stack_1a8,"equal (");
        std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,fVar26);
        std::operator<<((ostream *)&pp_Stack_1a8,", ");
        std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,fVar25);
        std::operator<<((ostream *)&pp_Stack_1a8,", ");
        std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,fVar24);
        std::operator<<((ostream *)&pp_Stack_1a8,", ");
        std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,fVar23);
        std::operator<<((ostream *)&pp_Stack_1a8,") ");
        std::operator<<((ostream *)&pp_Stack_1a8,
                        "exceeds allowed epsilon when compared to reference data equal (");
        std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,expected_rgba.m_data[0]);
        std::operator<<((ostream *)&pp_Stack_1a8,", ");
        pMVar11 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)auStack_1b0,expected_rgba.m_data + 1);
        std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,expected_rgba.m_data + 2);
        std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,expected_rgba.m_data + 3);
        std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").");
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Data comparison failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0xeb2);
        goto LAB_00cfd49e;
      }
      fVar22 = fVar25 - 0.0;
      fVar21 = -fVar22;
      if (-fVar22 <= fVar22) {
        fVar21 = fVar22;
      }
      if (0.00390625 < fVar21) goto LAB_00cfd2a7;
      fVar22 = fVar24 - 0.0;
      fVar21 = -fVar22;
      if (-fVar22 <= fVar22) {
        fVar21 = fVar22;
      }
      if (0.00390625 < fVar21) goto LAB_00cfd2a7;
      fVar22 = fVar23 - 0.0;
      fVar21 = -fVar22;
      if (-fVar22 <= fVar22) {
        fVar21 = fVar22;
      }
      if (0.00390625 < fVar21) goto LAB_00cfd2a7;
    }
  }
  return uVar5;
}

Assistant:

void GeometryShaderRenderingLinesCase::verify(_draw_call_type drawcall_type, unsigned int instance_id,
											  const unsigned char* data)
{
	const float  epsilon		  = 1.0f / 256.0f;
	unsigned int rt_height		  = 0;
	unsigned int rt_width		  = 0;
	unsigned int single_rt_height = 0;
	unsigned int single_rt_width  = 0;

	if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED ||
		drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED)
	{
		getRenderTargetSize(getAmountOfDrawInstances(), &rt_width, &rt_height);
	}
	else
	{
		getRenderTargetSize(1, &rt_width, &rt_height);
	}

	getRenderTargetSize(1, &single_rt_width, &single_rt_height);

	/* Verification is output type-specific */
	const unsigned int row_width = rt_width * 4 /* components */;

	switch (m_output_type)
	{
	case SHADER_OUTPUT_TYPE_LINE_STRIP:
	{
		/* The test renders a rectangle outline with 3 line segments for each edge.
		 * The verification checks color of each edge's middle line segment.
		 *
		 * Corners are skipped to keep the implementation simple. */
		for (unsigned int n_edge = 0; n_edge < 4 /* edges */; ++n_edge)
		{
			/* Determine edge-specific properties:
			 *
			 * Edge 0 - top edge;
			 * Edge 1 - right edge;
			 * Edge 2 - bottom edge;
			 * Edge 3 - left edge.
			 *
			 **/
			int		  end_x = 0;
			int		  end_y = 0;
			tcu::Vec4 expected_rgba;
			int		  start_x = 0;
			int		  start_y = 0;

			switch (n_edge)
			{
			case 0:
			{
				/* Top edge */
				start_x = 3;								  /* skip the corner */
				start_y = 1 + instance_id * single_rt_height; /* middle segment */

				end_x = single_rt_width - 3; /* skip the corner */
				end_y = start_y;

				expected_rgba = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f);

				break;
			}

			case 1:
			{
				/* Right edge */
				start_x = single_rt_width - 2;				  /* middle segment */
				start_y = 3 + instance_id * single_rt_height; /* skip the corner */

				end_x = start_x;
				end_y = start_y + single_rt_height - 6; /* skip the corners */

				expected_rgba = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f) * tcu::Vec4(0.5f);

				break;
			}

			case 2:
			{
				/* Bottom edge */
				start_x = 3;													 /* skip the corner */
				start_y = single_rt_height - 3 + instance_id * single_rt_height; /* middle segment */

				end_x = single_rt_width - 6; /* skip the corners */
				end_y = start_y;

				expected_rgba = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f) * tcu::Vec4(0.5f);

				break;
			}

			case 3:
			{
				/* Left edge */
				start_x = 1;								  /* middle segment */
				start_y = 3 + instance_id * single_rt_height; /* skip the corner */

				end_x = start_x;
				end_y = start_y + single_rt_height - 6; /* skip the corners */

				expected_rgba = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f);

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized edge index");
			}
			} /* switch(n_edge) */

			/* Move over the edge and make sure the rendered pixels are valid */
			int dx		 = (end_x != start_x) ? 1 : 0;
			int dy		 = (end_y != start_y) ? 1 : 0;
			int n_pixels = (end_x - start_x) + (end_y - start_y);

			for (int n_pixel = 0; n_pixel < n_pixels; ++n_pixel)
			{
				int cur_x = start_x + n_pixel * dx;
				int cur_y = start_y + n_pixel * dy;

				/* Calculate expected and rendered pixel color */
				const unsigned char* read_data		  = data + cur_y * row_width + cur_x * 4 /* components */;
				float				 rendered_rgba[4] = { 0 };

				for (unsigned int n_channel = 0; n_channel < 4 /* RGBA */; ++n_channel)
				{
					rendered_rgba[n_channel] = float(read_data[n_channel]) / 255.0f;
				}

				/* Compare the data */
				if (de::abs(rendered_rgba[0] - expected_rgba[0]) > epsilon ||
					de::abs(rendered_rgba[1] - expected_rgba[1]) > epsilon ||
					de::abs(rendered_rgba[2] - expected_rgba[2]) > epsilon ||
					de::abs(rendered_rgba[3] - expected_rgba[3]) > epsilon)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data at (" << cur_x << ", " << cur_y
									   << ") "
									   << "equal (" << rendered_rgba[0] << ", " << rendered_rgba[1] << ", "
									   << rendered_rgba[2] << ", " << rendered_rgba[3] << ") "
									   << "exceeds allowed epsilon when compared to reference data equal ("
									   << expected_rgba[0] << ", " << expected_rgba[1] << ", " << expected_rgba[2]
									   << ", " << expected_rgba[3] << ")." << tcu::TestLog::EndMessage;

					TCU_FAIL("Data comparison failed");
				} /* if (data comparison failed) */
			}	 /* for (all points) */
		}		  /* for (all edges) */

		break;
	} /* case SHADER_OUTPUT_TYPE_LINE_STRIP: */

	case SHADER_OUTPUT_TYPE_POINTS:
	{
		/* Verify centers of the points generated by geometry shader */
		int dx = 0;
		int dy = 0;

		bool ignore_first_point = false;
		int  start_x			= 0;
		int  start_y			= 0;

		tcu::Vec4 end_color;
		tcu::Vec4 start_color;

		for (unsigned int n_edge = 0; n_edge < 4 /* edges */; ++n_edge)
		{
			/* Determine edge-specific properties:
			 *
			 * Edge 0 - top edge; NOTE: the test should skip point at (1px, 1px) as it is overwritten by
			 *          edge 3!
			 * Edge 1 - right edge;
			 * Edge 2 - bottom edge;
			 * Edge 3 - left edge.
			 *
			 **/
			switch (n_edge)
			{
			case 0:
			{
				dx				   = 6;
				dy				   = 0;
				ignore_first_point = true;
				start_x			   = 1;
				start_y			   = 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f);
				start_color = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f);

				break;
			}

			case 1:
			{
				dx				   = 0;
				dy				   = 6;
				ignore_first_point = false;
				start_x			   = single_rt_width - 1;
				start_y			   = 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f);
				start_color = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f);

				break;
			}

			case 2:
			{
				dx				   = -6;
				dy				   = 0;
				ignore_first_point = false;
				start_x			   = single_rt_width - 1;
				start_y			   = single_rt_height - 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);
				start_color = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f);

				break;
			}

			case 3:
			{
				dx				   = 0;
				dy				   = -6;
				ignore_first_point = false;
				start_x			   = 1;
				start_y			   = single_rt_height - 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f);
				start_color = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized edge index");
			}
			} /* switch(n_edge) */

			for (unsigned int n_point = 0; n_point < 8 /* points */; ++n_point)
			{
				int cur_x = start_x + n_point * dx;
				int cur_y = start_y + n_point * dy;

				/* Skip the iteration if we're dealing with a first point, for which
				 * the comparison should be skipped */
				if (ignore_first_point && n_point == 0)
				{
					continue;
				}

				/* Calculate expected and rendered pixel color */
				const unsigned char* read_data		   = data + cur_y * row_width + cur_x * 4 /* components */;
				float				 reference_rgba[4] = { 0 };
				float				 rendered_rgba[4]  = { 0 };

				for (unsigned int n_channel = 0; n_channel < 4 /* RGBA */; ++n_channel)
				{
					reference_rgba[n_channel] = start_color[n_channel] +
												(end_color[n_channel] - start_color[n_channel]) * float(n_point) / 7.0f;
					rendered_rgba[n_channel] = (float)(read_data[n_channel]) / 255.0f;
				}

				/* Compare the data */
				if (de::abs(rendered_rgba[0] - reference_rgba[0]) > epsilon ||
					de::abs(rendered_rgba[1] - reference_rgba[1]) > epsilon ||
					de::abs(rendered_rgba[2] - reference_rgba[2]) > epsilon ||
					de::abs(rendered_rgba[3] - reference_rgba[3]) > epsilon)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data at (" << cur_x << ", " << cur_y
									   << ") "
									   << "equal (" << rendered_rgba[0] << ", " << rendered_rgba[1] << ", "
									   << rendered_rgba[2] << ", " << rendered_rgba[3] << ") "
									   << "exceeds allowed epsilon when compared to reference data equal ("
									   << reference_rgba[0] << ", " << reference_rgba[1] << ", " << reference_rgba[2]
									   << ", " << reference_rgba[3] << ")." << tcu::TestLog::EndMessage;

					TCU_FAIL("Data comparison failed");
				} /* if (data comparison failed) */

			} /* for (all points) */
		}	 /* for (all edges) */

		/* Done */
		break;
	} /* case SHADER_OUTPUT_TYPE_POINTS: */

	case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
	{
		/* The test renders four triangles - two vertices are taken from each edge and the third
		 * one is set at (0, 0, 0, 1) (screen-space). The rendering output is verified by
		 * sampling centroids off each triangle */
		for (unsigned int n_edge = 0; n_edge < 4 /* edges */; ++n_edge)
		{
			/* Determine edge-specific properties */
			tcu::Vec2 centroid;
			tcu::Vec4 reference_rgba;
			tcu::Vec2 v1;
			tcu::Vec2 v2;
			tcu::Vec2 v3 = tcu::Vec2(0.5f, 0.5f + float(instance_id));

			switch (n_edge)
			{
			case 0:
			{
				/* Top edge */
				v1 = tcu::Vec2(0.0f, float(instance_id) + 0.0f);
				v2 = tcu::Vec2(1.0f, float(instance_id) + 0.0f);

				reference_rgba = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f);

				break;
			}

			case 1:
			{
				/* Right edge */
				v1 = tcu::Vec2(1.0f, float(instance_id) + 0.0f);
				v2 = tcu::Vec2(1.0f, float(instance_id) + 1.0f);

				reference_rgba = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f);

				break;
			}

			case 2:
			{
				/* Bottom edge */
				v1 = tcu::Vec2(0.0f, float(instance_id) + 1.0f);
				v2 = tcu::Vec2(1.0f, float(instance_id) + 1.0f);

				reference_rgba = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f);

				break;
			}

			case 3:
			{
				/* Left edge */
				v1 = tcu::Vec2(0.0f, float(instance_id) + 0.0f);
				v2 = tcu::Vec2(0.0f, float(instance_id) + 1.0f);

				reference_rgba = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized edge index");
			}
			} /* switch (n_edge) */

			/* Calculate centroid of the triangle. */
			centroid[0] = (v1[0] + v2[0] + v3[0]) / 3.0f;
			centroid[1] = (v1[1] + v2[1] + v3[1]) / 3.0f;

			/* Retrieve the sample */
			int centroid_xy[2] = { int(centroid[0] * float(single_rt_width)),
								   int(centroid[1] * float(single_rt_height)) };
			const unsigned char* rendered_rgba_ubyte =
				data + centroid_xy[1] * row_width + centroid_xy[0] * 4 /* components */;
			const float rendered_rgba_float[] = {
				float(rendered_rgba_ubyte[0]) / 255.0f, float(rendered_rgba_ubyte[1]) / 255.0f,
				float(rendered_rgba_ubyte[2]) / 255.0f, float(rendered_rgba_ubyte[3]) / 255.0f,
			};

			/* Compare the reference and rendered pixels */
			if (de::abs(rendered_rgba_float[0] - reference_rgba[0]) > epsilon ||
				de::abs(rendered_rgba_float[1] - reference_rgba[1]) > epsilon ||
				de::abs(rendered_rgba_float[2] - reference_rgba[2]) > epsilon ||
				de::abs(rendered_rgba_float[3] - reference_rgba[3]) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data at (" << centroid_xy[0] << ", "
								   << centroid_xy[1] << ") "
								   << "equal (" << rendered_rgba_float[0] << ", " << rendered_rgba_float[1] << ", "
								   << rendered_rgba_float[2] << ", " << rendered_rgba_float[3] << ") "
								   << "exceeds allowed epsilon when compared to reference data equal ("
								   << reference_rgba[0] << ", " << reference_rgba[1] << ", " << reference_rgba[2]
								   << ", " << reference_rgba[3] << ")." << tcu::TestLog::EndMessage;

				TCU_FAIL("Data comparison failed");
			} /* if (data comparison failed) */
		}	 /* for (all edges) */

		break;
	}

	default:
	{
		TCU_FAIL("Unsupported shader output type used");
	}
	} /* switch (m_output_type) */
}